

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::writeLocalModel(Highs *this,HighsModel *model,string *filename)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  Filereader *pFVar4;
  HighsLogOptions *pHVar5;
  undefined8 uVar6;
  string *in_RDX;
  HighsLp *in_RSI;
  long in_RDI;
  HighsLogOptions *in_stack_00000048;
  HighsLp *in_stack_00000050;
  string *in_stack_00000058;
  Filereader *writer;
  HighsLp *lp;
  HighsStatus call_status;
  HighsStatus return_status;
  HighsLogOptions *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  HighsLogOptions *in_stack_fffffffffffffe80;
  HighsModel *in_stack_fffffffffffffe88;
  Filereader *pFVar7;
  Highs *in_stack_fffffffffffffe90;
  HighsOptions *in_stack_fffffffffffffe98;
  HighsLogOptions *in_stack_fffffffffffffea0;
  string *message;
  HighsSparseMatrix *in_stack_fffffffffffffea8;
  HighsStatus highs_return_status;
  undefined6 in_stack_fffffffffffffeb0;
  allocator local_131;
  string local_130 [32];
  string local_110 [88];
  string *in_stack_ffffffffffffff48;
  HighsLogOptions *in_stack_ffffffffffffff50;
  string local_90;
  Filereader *local_70;
  allocator local_51;
  string local_50 [40];
  HighsStatus local_28;
  HighsStatus local_24;
  string *local_20;
  HighsLp *local_18;
  HighsStatus local_4;
  
  local_24 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  HighsLp::setMatrixDimensions(in_RSI);
  HighsLp::ensureColwise((HighsLp *)0x4877f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"writeLocalModel",&local_51);
  uVar1 = lpDimensionsOk(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((bVar2 & 1) == 0) {
    if ((local_18[1].num_col_ < 1) ||
       (local_28 = assessHessianDimensions
                             (in_stack_fffffffffffffe98,(HighsHessian *)in_stack_fffffffffffffe90),
       local_28 != kError)) {
      local_28 = HighsSparseMatrix::assessStart(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0)
      ;
      highs_return_status = (HighsStatus)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      if (local_28 == kError) {
        local_4 = kError;
      }
      else {
        local_28 = HighsSparseMatrix::assessIndexBounds
                             ((HighsSparseMatrix *)in_stack_fffffffffffffe88,
                              in_stack_fffffffffffffe80);
        if (local_28 == kError) {
          local_4 = kError;
        }
        else {
          bVar3 = HighsNameHash::hasDuplicate
                            ((HighsNameHash *)in_stack_fffffffffffffea0,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffffe98);
          if (bVar3) {
            highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                         "Model has repeated column names\n");
            local_4 = returnFromHighs((Highs *)CONCAT17(uVar1,CONCAT16(bVar2,
                                                  in_stack_fffffffffffffeb0)),highs_return_status);
          }
          else {
            bVar3 = HighsNameHash::hasDuplicate
                              ((HighsNameHash *)in_stack_fffffffffffffea0,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffe98);
            if (bVar3) {
              highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                           "Model has repeated row names\n");
              local_4 = returnFromHighs((Highs *)CONCAT17(uVar1,CONCAT16(bVar2,
                                                  in_stack_fffffffffffffeb0)),highs_return_status);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60),
                                      (char *)in_stack_fffffffffffffe58);
              if (bVar3) {
                reportModel(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                local_24 = kOk;
              }
              else {
                message = &local_90;
                std::__cxx11::string::string((string *)message,local_20);
                pFVar4 = Filereader::getFilereader
                                   (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                std::__cxx11::string::~string((string *)&local_90);
                local_70 = pFVar4;
                if (pFVar4 == (Filereader *)0x0) {
                  pHVar5 = (HighsLogOptions *)(in_RDI + 0xe28);
                  uVar6 = std::__cxx11::string::c_str();
                  highsLogUser(pHVar5,kError,"Model file %s not supported\n",uVar6);
                  return kError;
                }
                pHVar5 = (HighsLogOptions *)(in_RDI + 0xe28);
                uVar6 = std::__cxx11::string::c_str();
                highsLogUser(pHVar5,kInfo,"Writing the model to %s\n",uVar6);
                HighsLogOptions::HighsLogOptions
                          ((HighsLogOptions *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe58);
                pFVar7 = local_70;
                std::__cxx11::string::string(local_110,local_20);
                (*pFVar7->_vptr_Filereader[1])(pFVar7,in_RDI + 0xaa8,local_110,local_18);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_130,"writeModelToFile",&local_131);
                local_24 = interpretCallStatus((HighsLogOptions *)
                                               CONCAT17(uVar1,CONCAT16(bVar2,
                                                  in_stack_fffffffffffffeb0)),
                                               (HighsStatus)((ulong)pFVar4 >> 0x20),
                                               (HighsStatus)pFVar4,message);
                highs_return_status = (HighsStatus)((ulong)pFVar4 >> 0x20);
                std::__cxx11::string::~string(local_130);
                std::allocator<char>::~allocator((allocator<char> *)&local_131);
                std::__cxx11::string::~string(local_110);
                HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x487cd3);
                if (local_70 != (Filereader *)0x0) {
                  (*local_70->_vptr_Filereader[3])();
                }
              }
              local_4 = returnFromHighs((Highs *)CONCAT17(uVar1,CONCAT16(bVar2,
                                                  in_stack_fffffffffffffeb0)),highs_return_status);
            }
          }
        }
      }
    }
    else {
      local_4 = kError;
    }
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::writeLocalModel(HighsModel& model,
                                   const std::string& filename) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;

  HighsLp& lp = model.lp_;
  // Dimensions in a_matrix_ may not be set, so take them from lp
  lp.setMatrixDimensions();

  // Ensure that the LP is column-wise
  lp.ensureColwise();

  // Ensure that the dimensions are OK
  if (!lpDimensionsOk("writeLocalModel", lp, options_.log_options))
    return HighsStatus::kError;

  if (model.hessian_.dim_ > 0) {
    call_status = assessHessianDimensions(options_, model.hessian_);
    if (call_status == HighsStatus::kError) return call_status;
  }

  // Check that the matrix starts are OK
  call_status = lp.a_matrix_.assessStart(options_.log_options);
  if (call_status == HighsStatus::kError) return call_status;

  // Check that the matrix indices are within bounds
  call_status = lp.a_matrix_.assessIndexBounds(options_.log_options);
  if (call_status == HighsStatus::kError) return call_status;

  // Check for repeated column or row names that would corrupt the file
  if (model.lp_.col_hash_.hasDuplicate(model.lp_.col_names_)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has repeated column names\n");
    return returnFromHighs(HighsStatus::kError);
  }
  if (model.lp_.row_hash_.hasDuplicate(model.lp_.row_names_)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has repeated row names\n");
    return returnFromHighs(HighsStatus::kError);
  }
  if (filename == "") {
    // Empty file name: report model on logging stream
    reportModel(model);
    return_status = HighsStatus::kOk;
  } else {
    Filereader* writer =
        Filereader::getFilereader(options_.log_options, filename);
    if (writer == NULL) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Model file %s not supported\n", filename.c_str());
      return HighsStatus::kError;
    }
    // Report to user that model is being written
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the model to %s\n", filename.c_str());
    return_status =
        interpretCallStatus(options_.log_options,
                            writer->writeModelToFile(options_, filename, model),
                            return_status, "writeModelToFile");
    delete writer;
  }
  return returnFromHighs(return_status);
}